

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

block_state deflate_rle(deflate_state *s,int flush)

{
  long lVar1;
  Bytef BVar2;
  uInt uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uInt uVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  Bytef *pBVar13;
  long lVar14;
  
  do {
    uVar8 = s->lookahead;
    if (uVar8 < 0x102) {
      fill_window(s);
      uVar8 = s->lookahead;
      if (flush == 0 && uVar8 < 0x102) {
        return need_more;
      }
      if (uVar8 == 0) {
        uVar4 = s->block_start;
        if ((long)uVar4 < 0) {
          pBVar13 = (Bytef *)0x0;
        }
        else {
          pBVar13 = s->window + (uVar4 & 0xffffffff);
        }
        _tr_flush_block(s,(charf *)pBVar13,s->strstart - uVar4,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out != 0) {
          return (uint)(flush == 4) * 2 + block_done;
        }
        return (uint)(flush == 4) * 2;
      }
      s->match_length = 0;
      uVar7 = s->strstart;
      if (2 < uVar8) goto LAB_0042d20d;
LAB_0042d2bb:
      uVar8 = s->last_lit;
LAB_0042d2c2:
      bVar10 = s->window[uVar7];
      s->d_buf[uVar8] = 0;
      s->last_lit = uVar8 + 1;
      s->l_buf[uVar8] = bVar10;
      s->dyn_ltree[bVar10].fc.freq = s->dyn_ltree[bVar10].fc.freq + 1;
      uVar9 = s->last_lit;
      uVar3 = s->lit_bufsize;
      s->lookahead = s->lookahead - 1;
      uVar8 = s->strstart + 1;
      s->strstart = uVar8;
    }
    else {
      s->match_length = 0;
      uVar7 = s->strstart;
LAB_0042d20d:
      if (uVar7 == 0) goto LAB_0042d2bb;
      pBVar13 = s->window;
      BVar2 = pBVar13[(ulong)uVar7 - 1];
      if (((BVar2 != pBVar13[uVar7]) || (pBVar13 = pBVar13 + uVar7, BVar2 != pBVar13[1])) ||
         (BVar2 != pBVar13[2])) goto LAB_0042d2bb;
      iVar5 = (int)pBVar13;
      lVar14 = 0;
      do {
        iVar11 = (int)lVar14;
        if (BVar2 != pBVar13[lVar14 + 3]) {
          iVar11 = iVar5 + iVar11 + 3;
          goto LAB_0042d3b2;
        }
        if (BVar2 != pBVar13[lVar14 + 4]) {
          iVar11 = iVar5 + iVar11 + 4;
          goto LAB_0042d3b2;
        }
        if (BVar2 != pBVar13[lVar14 + 5]) {
          iVar11 = iVar5 + iVar11 + 5;
          goto LAB_0042d3b2;
        }
        if (BVar2 != pBVar13[lVar14 + 6]) {
          iVar11 = iVar5 + iVar11 + 6;
          goto LAB_0042d3b2;
        }
        if (BVar2 != pBVar13[lVar14 + 7]) {
          iVar11 = iVar5 + iVar11 + 7;
          goto LAB_0042d3b2;
        }
        if (BVar2 != pBVar13[lVar14 + 8]) {
          iVar11 = iVar5 + iVar11 + 8;
          goto LAB_0042d3b2;
        }
        if (BVar2 != pBVar13[lVar14 + 9]) {
          iVar11 = iVar5 + iVar11 + 9;
          goto LAB_0042d3b2;
        }
        lVar1 = lVar14 + 8;
      } while ((lVar14 + 2U < 0xfa) &&
              (lVar6 = lVar14 + 10, lVar14 = lVar1, BVar2 == pBVar13[lVar6]));
      iVar11 = iVar5 + (int)lVar1 + 2;
LAB_0042d3b2:
      uVar12 = (iVar11 - (iVar5 + 0x102)) + 0x102;
      if (uVar8 <= uVar12) {
        uVar12 = uVar8;
      }
      s->match_length = uVar12;
      uVar8 = s->last_lit;
      if (uVar12 < 3) goto LAB_0042d2c2;
      bVar10 = (char)uVar12 - 3;
      s->d_buf[uVar8] = 1;
      s->last_lit = uVar8 + 1;
      s->l_buf[uVar8] = bVar10;
      s->dyn_ltree[(ulong)""[bVar10] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar10] + 0x101].fc.freq + 1;
      s->dyn_dtree[0].fc.freq = s->dyn_dtree[0].fc.freq + 1;
      uVar9 = s->last_lit;
      uVar3 = s->lit_bufsize;
      s->lookahead = s->lookahead - s->match_length;
      uVar8 = s->match_length + s->strstart;
      s->strstart = uVar8;
      s->match_length = 0;
    }
    if (uVar9 == uVar3 - 1) {
      uVar4 = s->block_start;
      if ((long)uVar4 < 0) {
        pBVar13 = (Bytef *)0x0;
      }
      else {
        pBVar13 = s->window + (uVar4 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar13,uVar8 - uVar4,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_rle(deflate_state *s, int flush)
{
    int bflush;             /* set if current block must be flushed */
    uInt prev;              /* byte at distance one to match */
    Bytef *scan, *strend;   /* scan goes up to strend for length of run */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the longest encodable run.
         */
        if (s->lookahead < MAX_MATCH) {
            fill_window(s);
            if (s->lookahead < MAX_MATCH && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* See how many times the previous byte repeats */
        s->match_length = 0;
        if (s->lookahead >= MIN_MATCH && s->strstart > 0) {
            scan = s->window + s->strstart - 1;
            prev = *scan;
            if (prev == *++scan && prev == *++scan && prev == *++scan) {
                strend = s->window + s->strstart + MAX_MATCH;
                do {
                } while (prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         scan < strend);
                s->match_length = MAX_MATCH - (int)(strend - scan);
                if (s->match_length > s->lookahead)
                    s->match_length = s->lookahead;
            }
        }

        /* Emit match if have run of MIN_MATCH or longer, else emit literal */
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->strstart - 1, s->match_length);

            _tr_tally_dist(s, 1, s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;
            s->strstart += s->match_length;
            s->match_length = 0;
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit (s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}